

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall UnifiedRegex::CharSetInner::FreeSelf(CharSetInner *this,ArenaAllocator *allocator)

{
  CharSetNode *pCVar1;
  long lVar2;
  
  lVar2 = 1;
  do {
    pCVar1 = this->children[lVar2 + -1];
    if (pCVar1 != (CharSetNode *)0x0) {
      (**pCVar1->_vptr_CharSetNode)(pCVar1,allocator);
      this->children[lVar2 + -1] = (CharSetNode *)0x0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x11);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             this,0x88);
  return;
}

Assistant:

void CharSetInner::FreeSelf(ArenaAllocator* allocator)
    {
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != 0)
            {
                children[i]->FreeSelf(allocator);
#if DBG
                children[i] = 0;
#endif
            }
        }
        Adelete(allocator, this);
    }